

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_cptrapcc_0(m68k_info *info)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((info->type & 0x1c) != 0) {
    uVar2 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    uVar3 = 0x2a;
    if (uVar2 + 2 <= info->code_len) {
      uVar3 = info->code[uVar2 + 1] & 0x2f;
    }
    info->pc = info->pc + 2;
    MCInst_setOpcode(info->inst,0xee);
    (info->extension).op_count = '\0';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + uVar3;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cptrapcc_0(m68k_info *info)
{
	uint extension1;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);

	build_init_op(info, M68K_INS_FTRAPF, 0, 0);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);
}